

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_bcast_parts
          (REF_MPI ref_mpi,REF_INT *part_complete,REF_INT *part_ncell,REF_INT max_ncell,
          REF_INT node_per,REF_DBL *param_6,REF_INT *ncell,REF_DBL **xyz)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong __size;
  undefined4 in_register_00000084;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  iVar1 = *part_complete;
  lVar12 = (long)iVar1;
  if (iVar1 < ref_mpi->n) {
    iVar2 = part_ncell[lVar12];
    iVar6 = 0;
    lVar9 = lVar12;
    do {
      iVar11 = iVar6;
      lVar9 = lVar9 + 1;
      *(int *)param_6 = iVar2;
      if (ref_mpi->n <= lVar9) break;
      iVar2 = iVar2 + part_ncell[lVar9];
      iVar6 = iVar11 + -1;
    } while (iVar2 < 0xf4241);
    iVar2 = (iVar1 - iVar11) + 1;
    *part_complete = iVar2;
    iVar6 = (int)((long)max_ncell * 3);
    uVar3 = *(int *)param_6 * iVar6;
    if (-1 < (int)uVar3) {
      __size = (ulong)uVar3 << 3;
      pvVar5 = malloc(__size);
      *(void **)ncell = pvVar5;
      if (pvVar5 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x64e,"ref_phys_bcast_parts","malloc *xyz of REF_DBL NULL");
        return 2;
      }
      iVar13 = 0;
      if (iVar1 <= iVar1 - iVar11) {
        iVar13 = 0;
        do {
          iVar1 = part_ncell[lVar12];
          uVar3 = iVar1 * iVar6;
          iVar11 = (int)lVar12;
          if (ref_mpi->id == iVar11) {
            if (0 < iVar1) {
              uVar4 = ref_mpi_bcast_from_rank
                                (ref_mpi,(void *)CONCAT44(in_register_00000084,node_per),uVar3,3,
                                 iVar11);
              __size = __size & 0xffffffff;
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x657,"ref_phys_bcast_parts",(ulong)uVar4,"bcast ncell");
                __size = (ulong)uVar4;
              }
              if (uVar4 != 0) {
                return (REF_STATUS)__size;
              }
              if (0 < (int)uVar3) {
                lVar9 = *(long *)ncell;
                uVar7 = 0;
                do {
                  *(undefined8 *)((long)iVar13 * 8 + lVar9 + uVar7 * 8) =
                       *(undefined8 *)((long)CONCAT44(in_register_00000084,node_per) + uVar7 * 8);
                  uVar7 = uVar7 + 1;
                } while (uVar3 != uVar7);
              }
            }
          }
          else if (0 < iVar1) {
            uVar4 = ref_mpi_bcast_from_rank
                              (ref_mpi,(void *)((long)iVar13 * 8 + *(long *)ncell),uVar3,3,iVar11);
            __size = __size & 0xffffffff;
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x65e,"ref_phys_bcast_parts",(ulong)uVar4,"bcast ncell");
              __size = (ulong)uVar4;
            }
            if (uVar4 != 0) {
              return (REF_STATUS)__size;
            }
          }
          iVar13 = iVar13 + uVar3;
          lVar12 = lVar12 + 1;
        } while (iVar2 != (int)lVar12);
      }
      lVar12 = (long)*(int *)param_6 * (long)max_ncell * 3;
      if ((int)lVar12 != iVar13) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x664,"ref_phys_bcast_parts","miscount",lVar12,(long)iVar13);
        return 1;
      }
      return 0;
    }
    pcVar10 = "malloc *xyz of REF_DBL negative";
    uVar8 = 0x64e;
  }
  else {
    pcVar10 = "already complete";
    uVar8 = 0x641;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar8,
         "ref_phys_bcast_parts",pcVar10);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_bcast_parts(
    REF_MPI ref_mpi, REF_INT *part_complete, REF_INT *part_ncell,
    REF_INT max_ncell, REF_INT node_per, REF_DBL *local_xyz, REF_INT *ncell,
    REF_DBL **xyz) {
  REF_INT total;
  REF_INT first_part, last_part;
  REF_INT offset, part, i;
  RAS(*part_complete < ref_mpi_n(ref_mpi), "already complete");
  first_part = *part_complete;
  last_part = *part_complete;
  (*ncell) = part_ncell[first_part];

  for (part = first_part + 1; part < ref_mpi_n(ref_mpi); part++) {
    if ((*ncell) + part_ncell[part] > max_ncell) break;
    last_part = part;
    (*ncell) += part_ncell[part];
  }
  (*part_complete) = last_part + 1;

  total = 3 * node_per * (*ncell);
  ref_malloc(*xyz, total, REF_DBL);

  offset = 0;
  for (part = first_part; part <= last_part; part++) {
    total = 3 * node_per * part_ncell[part];
    if (part == ref_mpi_rank(ref_mpi)) {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, local_xyz, total, REF_DBL_TYPE,
                                    part),
            "bcast ncell");
        for (i = 0; i < total; i++) (*xyz)[i + offset] = local_xyz[i];
      }
    } else {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, &((*xyz)[offset]), total,
                                    REF_DBL_TYPE, part),
            "bcast ncell");
      }
    }
    offset += total;
  }
  total = 3 * node_per * (*ncell);
  REIS(total, offset, "miscount");

  return REF_SUCCESS;
}